

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

MessageBuilder * __thiscall el::base::MessageBuilder::operator<<(MessageBuilder *this,char *msg)

{
  bool bVar1;
  stringstream_t *psVar2;
  element_type *this_00;
  char *msg_local;
  MessageBuilder *this_local;
  
  psVar2 = Logger::stream_abi_cxx11_(this->m_logger);
  std::operator<<((ostream *)(psVar2 + 0x10),msg);
  this_00 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)elStorage);
  bVar1 = Storage::hasFlag(this_00,AutoSpacing);
  if (bVar1) {
    psVar2 = Logger::stream_abi_cxx11_(this->m_logger);
    std::operator<<((ostream *)(psVar2 + 0x10)," ");
  }
  return this;
}

Assistant:

inline MessageBuilder& operator<<(const std::wstring& msg) {
    return operator<<(msg.c_str());
  }